

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O2

Pubkey * cfd::core::ConvertSecpPubkey(Pubkey *__return_storage_ptr__,secp256k1_pubkey *pubkey)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  allocator local_81;
  size_t result_bytes_size;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result_bytes;
  string local_48;
  
  ctx = wally_get_secp_context();
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&result_bytes,0x21,(allocator_type *)&local_48);
  result_bytes_size =
       (long)result_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)result_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  iVar1 = secp256k1_ec_pubkey_serialize
                    (ctx,result_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,&result_bytes_size,pubkey,0x102);
  if ((iVar1 == 1) && (result_bytes_size == 0x21)) {
    ByteData::ByteData((ByteData *)&local_78,&result_bytes);
    Pubkey::Pubkey(__return_storage_ptr__,(ByteData *)&local_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&result_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_48,"Secp256k1 serialize exception",&local_81);
  CfdException::CfdException(this,kCfdInternalError,&local_48);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Pubkey ConvertSecpPubkey(const secp256k1_pubkey& pubkey) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> result_bytes(Pubkey::kCompressedPubkeySize);
  size_t result_bytes_size = result_bytes.size();
  int ret = secp256k1_ec_pubkey_serialize(
      ctx, result_bytes.data(), &result_bytes_size, &pubkey,
      SECP256K1_EC_COMPRESSED);
  if (ret != 1 || (result_bytes_size != Pubkey::kCompressedPubkeySize)) {
    throw CfdException(
        CfdError::kCfdInternalError, "Secp256k1 serialize exception");
  }

  return Pubkey(result_bytes);
}